

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test::testBody
          (TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  StringEqualFailure f;
  undefined1 local_88 [120];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_88,"");
  StringEqualFailure::StringEqualFailure
            ((StringEqualFailure *)(local_88 + 0x10),pUVar1,"fail.cpp",2,
             "StringWith\t\nDifferentString","StringWith\t\ndifferentString",
             (SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <StringWith\\t\\nDifferentString>\n\tbut was  <StringWith\\t\\ndifferentString>\n\tdifference starts at position 12 at: <ngWith\\t\\ndifferentS>\n\t                                                ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0xda,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
  return;
}

Assistant:

TEST(TestFailure, StringsEqualFailureWithNewLinesAndTabs)
{
    StringEqualFailure f(test, failFileName, failLineNumber,
            "StringWith\t\nDifferentString",
            "StringWith\t\ndifferentString", "");

    FAILURE_EQUAL("expected <StringWith\\t\\nDifferentString>\n"
                "\tbut was  <StringWith\\t\\ndifferentString>\n"
                "\tdifference starts at position 12 at: <ngWith\\t\\ndifferentS>\n"
                "\t                                                ^", f);
}